

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteLight(ColladaExporter *this,size_t pIndex)

{
  undefined1 *puVar1;
  string *psVar2;
  string *psVar3;
  char *__s;
  aiLight *light;
  ostream *poVar4;
  string lightId;
  string lightName;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  light = this->mScene->mLights[pIndex];
  __s = (light->mName).data;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,__s,(allocator<char> *)&local_68);
  XMLEscape(&local_48,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_89);
  XMLIDEncode(&local_88,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  puVar1 = &this->field_0x38;
  psVar2 = &this->startstr;
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"<light id=\"");
  poVar4 = std::operator<<(poVar4,(string *)&local_88);
  poVar4 = std::operator<<(poVar4,"-light\" name=\"");
  poVar4 = std::operator<<(poVar4,(string *)&local_48);
  poVar4 = std::operator<<(poVar4,"\" >");
  psVar3 = &this->endstr;
  std::operator<<(poVar4,(string *)psVar3);
  PushTag(this);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"<technique_common>");
  std::operator<<(poVar4,(string *)psVar3);
  PushTag(this);
  switch(light->mType) {
  case aiLightSource_DIRECTIONAL:
    WriteDirectionalLight(this,light);
    break;
  case aiLightSource_POINT:
    WritePointLight(this,light);
    break;
  case aiLightSource_SPOT:
    WriteSpotLight(this,light);
    break;
  case aiLightSource_AMBIENT:
    WriteAmbienttLight(this,light);
  }
  PopTag(this);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"</technique_common>");
  std::operator<<(poVar4,(string *)psVar3);
  PopTag(this);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"</light>");
  std::operator<<(poVar4,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void ColladaExporter::WriteLight(size_t pIndex){

    const aiLight *light = mScene->mLights[pIndex];
    const std::string lightName = XMLEscape(light->mName.C_Str());
    const std::string lightId = XMLIDEncode(light->mName.C_Str());

    mOutput << startstr << "<light id=\"" << lightId << "-light\" name=\""
            << lightName << "\" >" << endstr;
    PushTag();
    mOutput << startstr << "<technique_common>" << endstr;
    PushTag();
    switch(light->mType){
        case aiLightSource_AMBIENT:
            WriteAmbienttLight(light);
            break;
        case aiLightSource_DIRECTIONAL:
            WriteDirectionalLight(light);
            break;
        case aiLightSource_POINT:
            WritePointLight(light);
            break;
        case aiLightSource_SPOT:
            WriteSpotLight(light);
            break;
        case aiLightSource_AREA:
        case aiLightSource_UNDEFINED:
        case _aiLightSource_Force32Bit:
            break;
    }
    PopTag();
    mOutput << startstr << "</technique_common>" << endstr;

    PopTag();
    mOutput << startstr << "</light>" << endstr;

}